

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_End_Test::~TEST_TeamCityOutputTest_TestNameEscaped_End_Test
          (TEST_TeamCityOutputTest_TestNameEscaped_End_Test *this)

{
  TEST_TeamCityOutputTest_TestNameEscaped_End_Test *this_local;
  
  ~TEST_TeamCityOutputTest_TestNameEscaped_End_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_End)
{
	tst->setTestName("'[]\n\r");
	result->currentTestStarted(tst);
	result->currentTestEnded(tst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testFinished name='|'|[|]|n|r' duration='0']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}